

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

clip_image_size
llava_uhd::get_refine_size
          (clip_image_size *original_size,clip_image_size *grid,int scale_resolution,int patch_size,
          bool allow_upscale)

{
  int iVar1;
  clip_image_size cVar2;
  int iVar3;
  int scale_resolution_00;
  clip_image_size cVar4;
  int *in_RSI;
  int best_grid_height;
  int best_grid_width;
  clip_image_size best_grid_size;
  clip_image_size grid_size;
  int refine_height;
  int refine_width;
  int grid_y;
  int grid_x;
  int height;
  int width;
  clip_image_size refine_size;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int iStack_48;
  int iVar5;
  
  iVar1 = *in_RSI;
  iVar5 = in_RSI[1];
  iVar3 = ensure_divide(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  scale_resolution_00 = ensure_divide(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  cVar4 = get_best_resize((clip_image_size *)CONCAT44(iVar5,iVar3),scale_resolution_00,
                          scale_resolution_00 / iVar5,SUB41((uint)(iVar3 / iVar1) >> 0x18,0));
  iStack_48 = cVar4.height;
  cVar2.height = iStack_48 * iVar5;
  cVar2.width = cVar4.width * iVar1;
  return cVar2;
}

Assistant:

static clip_image_size get_refine_size(const clip_image_size & original_size, const clip_image_size & grid, int scale_resolution, int patch_size, bool allow_upscale = false) {
        int width  = original_size.width;
        int height = original_size.height;
        int grid_x = grid.width;
        int grid_y = grid.height;

        int refine_width  = ensure_divide(width, grid_x);
        int refine_height = ensure_divide(height, grid_y);

        clip_image_size grid_size;
        grid_size.width  = refine_width  / grid_x;
        grid_size.height = refine_height / grid_y;

        auto best_grid_size  = get_best_resize(grid_size, scale_resolution, patch_size, allow_upscale);
        int best_grid_width  = best_grid_size.width;
        int best_grid_height = best_grid_size.height;

        clip_image_size refine_size;
        refine_size.width  = best_grid_width  * grid_x;
        refine_size.height = best_grid_height * grid_y;
        return refine_size;
    }